

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveSimpleObject.cpp
# Opt level: O0

string * __thiscall
PrimitiveSimpleObject::GetTypename_abi_cxx11_
          (string *__return_storage_ptr__,PrimitiveSimpleObject *this)

{
  PrimitiveSimpleObject *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->type_->type_name_);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveSimpleObject::GetTypename() { return type_->type_name_; }